

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_copy.c
# Opt level: O2

void crypto_sign_ed25519_ref10_fe_copy(int32_t *h,int32_t *f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  uVar2 = *(undefined8 *)(f + 2);
  uVar3 = *(undefined8 *)(f + 4);
  uVar4 = *(undefined8 *)(f + 6);
  uVar1 = *(undefined8 *)(f + 8);
  *(undefined8 *)h = *(undefined8 *)f;
  *(undefined8 *)(h + 2) = uVar2;
  *(undefined8 *)(h + 4) = uVar3;
  *(undefined8 *)(h + 6) = uVar4;
  *(undefined8 *)(h + 8) = uVar1;
  return;
}

Assistant:

void fe_copy(fe h,const fe f)
{
  crypto_int32 f0 = f[0];
  crypto_int32 f1 = f[1];
  crypto_int32 f2 = f[2];
  crypto_int32 f3 = f[3];
  crypto_int32 f4 = f[4];
  crypto_int32 f5 = f[5];
  crypto_int32 f6 = f[6];
  crypto_int32 f7 = f[7];
  crypto_int32 f8 = f[8];
  crypto_int32 f9 = f[9];
  h[0] = f0;
  h[1] = f1;
  h[2] = f2;
  h[3] = f3;
  h[4] = f4;
  h[5] = f5;
  h[6] = f6;
  h[7] = f7;
  h[8] = f8;
  h[9] = f9;
}